

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
merlin::convert_index::convert_index
          (convert_index *this,vector<merlin::variable,_std::allocator<merlin::variable>_> *order,
          bool source_big_endian,bool target_big_endian)

{
  pointer *ppvVar1;
  __normal_iterator<const_merlin::variable_*,_std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>
  B;
  __normal_iterator<const_merlin::variable_*,_std::vector<merlin::variable,_std::allocator<merlin::variable>_>_>
  E;
  iterator __position;
  size_t size_hint;
  long lVar2;
  variable_set _vs;
  variable local_78;
  variable_set local_68;
  
  (this->m_target_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_target_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_source_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_target_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_source_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_source_order).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<merlin::variable,_std::allocator<merlin::variable>_>::operator=
            (&this->m_source_order,order);
  this->m_source_big_endian = source_big_endian;
  this->m_target_big_endian = target_big_endian;
  B._M_current = (order->super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  E._M_current = (order->super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
  size_hint = (long)E._M_current - (long)B._M_current >> 4;
  this->m_n = size_hint;
  variable_set::
  variable_set<__gnu_cxx::__normal_iterator<merlin::variable_const*,std::vector<merlin::variable,std::allocator<merlin::variable>>>>
            (&local_68,B,E,size_hint);
  if (local_68.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_68.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar2 = 0;
    do {
      local_78.m_label =
           local_68.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      local_78.m_states = local_68.m_d[lVar2];
      __position._M_current =
           (this->m_target_order).
           super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_target_order).
          super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<merlin::variable,std::allocator<merlin::variable>>::
        _M_realloc_insert<merlin::variable_const&>
                  ((vector<merlin::variable,std::allocator<merlin::variable>> *)
                   &this->m_target_order,__position,&local_78);
      }
      else {
        (__position._M_current)->m_label = local_78.m_label;
        (__position._M_current)->m_states = local_78.m_states;
        ppvVar1 = &(this->m_target_order).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != (long)local_68.m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  variable_set::~variable_set(&local_68);
  return;
}

Assistant:

convert_index(const std::vector<variable>& order, bool source_big_endian = false,
			bool target_big_endian = false) {

		m_source_order = order; // save source variable order
		m_source_big_endian = source_big_endian; // source representation
		m_target_big_endian = target_big_endian; // target representation
		m_n = order.size(); // size of the source/target variable orders

		variable_set _vs = variable_set(order.begin(), order.end(), order.size());
		for (variable_set::const_iterator i = _vs.begin(); i != _vs.end(); ++i) {
			m_target_order.push_back(*i);
		}
	}